

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm_manager.cc
# Opt level: O1

RC __thiscall SM_Manager::CalcStats(SM_Manager *this,char *relName)

{
  RM_FileHandle **ppRVar1;
  float *pfVar2;
  int iVar3;
  bool bVar4;
  char *fileName;
  RC RVar5;
  RC RVar6;
  size_t sVar7;
  Attr *pAVar8;
  long lVar9;
  SM_Manager *pSVar10;
  RM_FileHandle *fh_00;
  RelCatEntry *rEntry;
  long lVar11;
  long lVar12;
  int iVar13;
  float fVar14;
  RelCatEntry *relEntry;
  char *local_1c0;
  Attr *local_1b8;
  SM_Manager *local_1b0;
  RM_Record attrRec;
  AttrCatEntry *aEntry;
  SM_AttrIterator attrIt;
  RM_Record rec;
  vector<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  numDistinct;
  RM_Record relRec;
  RM_FileHandle fh;
  RM_FileScan fs;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Calculating stats for relation ",0x1f);
  if (relName == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x12b1d0);
  }
  else {
    sVar7 = strlen(relName);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,relName,sVar7);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
  std::ostream::put(-0x30);
  std::ostream::flush();
  sVar7 = strlen(relName);
  if (0x18 < sVar7) {
    return 0x12e;
  }
  RM_Record::RM_Record(&relRec);
  RVar5 = GetRelEntry(this,relName,&relRec,&relEntry);
  rEntry = relEntry;
  if (RVar5 != 0) goto LAB_0010b8dd;
  iVar13 = relEntry->attrCount;
  local_1c0 = relName;
  local_1b0 = this;
  pAVar8 = (Attr *)malloc((long)iVar13 * 0x30);
  local_1b8 = pAVar8;
  if (0 < (long)iVar13) {
    lVar9 = 0;
    do {
      pAVar8->numDistinct = 0;
      pAVar8->maxValue = 0.0;
      *(undefined8 *)&pAVar8->minValue = 0;
      *(undefined8 *)&pAVar8->ih = 0;
      pAVar8->recInsert = (_func_bool_char_ptr_string_int *)0x0;
      pAVar8->offset = 0;
      pAVar8->type = 0;
      pAVar8->length = 0;
      pAVar8->indexNo = 0;
      IX_Manager::DestroyIndex((IX_Manager *)&fs);
      attrIt.validIterator = false;
      attrIt._1_7_ = 0;
      attrIt.fs.openScan = false;
      attrIt.fs._1_7_ = 0;
      attrIt.fs.comparator = recInsert_string;
      attrIt.fs.attrOffset = 0;
      attrIt.fs._28_8_ = 0x7f7fffff00800000;
      pAVar8->offset = 0;
      pAVar8->type = 0;
      pAVar8->length = 0;
      pAVar8->indexNo = 0;
      *(undefined4 *)((long)&pAVar8->recInsert + 4) = 0;
      pAVar8->numDistinct = 0;
      pAVar8->maxValue = 1.1754944e-38;
      pAVar8->minValue = 3.4028235e+38;
      *(RM_FileHandle **)&pAVar8->ih = attrIt.fs.fileHandle;
      pAVar8->recInsert = recInsert_string;
      IX_IndexHandle::~IX_IndexHandle((IX_IndexHandle *)&attrIt.fs.fileHandle);
      IX_IndexHandle::~IX_IndexHandle((IX_IndexHandle *)&fs);
      lVar9 = lVar9 + 1;
      pAVar8 = pAVar8 + 1;
      rEntry = relEntry;
    } while (lVar9 < relEntry->attrCount);
  }
  pSVar10 = local_1b0;
  RVar5 = PrepareAttr(local_1b0,rEntry,local_1b8);
  if (RVar5 != 0) goto LAB_0010b8dd;
  std::
  vector<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::vector(&numDistinct,(long)relEntry->attrCount,(allocator_type *)&attrIt);
  fileName = local_1c0;
  iVar13 = relEntry->attrCount;
  if (0 < (long)iVar13) {
    lVar9 = 0;
    do {
      *(undefined4 *)((long)&local_1b8->numDistinct + lVar9) = 0;
      *(undefined8 *)((long)&local_1b8->maxValue + lVar9) = 0x7f7fffff00800000;
      lVar9 = lVar9 + 0x30;
    } while ((long)iVar13 * 0x30 != lVar9);
  }
  relEntry->numTuples = 0;
  relEntry->statsInitialized = true;
  RM_FileScan::RM_FileScan(&fs);
  RM_FileHandle::RM_FileHandle(&fh);
  RM_Record::RM_Record(&rec);
  RVar5 = RM_Manager::OpenFile(pSVar10->rmm,fileName,&fh);
  if ((RVar5 == 0) &&
     (RVar5 = RM_FileScan::OpenScan(&fs,&fh,INT,0,0,NO_OP,(void *)0x0,NO_HINT), RVar5 == 0)) {
    ppRVar1 = &attrIt.fs.fileHandle;
    do {
      RVar5 = RM_FileScan::GetNextRec(&fs,&rec);
      if (RVar5 == 0x6e) {
        RVar5 = RM_FileHandle::UpdateRec(&pSVar10->relcatFH,&relRec);
        if ((RVar5 == 0) && (RVar5 = RM_FileHandle::ForcePages(&pSVar10->relcatFH,-1), RVar5 == 0))
        {
          SM_AttrIterator::SM_AttrIterator(&attrIt);
          fh_00 = &pSVar10->attrcatFH;
          RVar5 = SM_AttrIterator::OpenIterator(&attrIt,fh_00,relEntry->relName);
          if (RVar5 != 0) goto LAB_0010b89f;
          RM_Record::RM_Record(&attrRec);
          bVar4 = 0 < relEntry->attrCount;
          if (relEntry->attrCount < 1) goto LAB_0010b86d;
          iVar13 = 0;
          goto LAB_0010b7f0;
        }
        break;
      }
      RVar6 = RM_Record::GetData(&rec,(char **)&attrRec);
      RVar5 = RVar6;
      if (RVar6 == 0) {
        if (0 < relEntry->attrCount) {
          lVar11 = 0;
          lVar9 = 0;
          do {
            lVar12 = (long)*(int *)((long)&local_1b8->offset + lVar11);
            attrIt._0_8_ = ppRVar1;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&attrIt,(long)attrRec.rid + lVar12,
                       (long)*(int *)((long)&local_1b8->length + lVar11) +
                       (long)attrRec.rid + lVar12);
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)(&((numDistinct.
                              super__Vector_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->_M_t)._M_impl.field_0x0 +
                          lVar11),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&attrIt)
            ;
            iVar13 = *(int *)((long)&local_1b8->type + lVar11);
            if (iVar13 == 0) {
              fVar14 = (float)*(int *)((long)attrRec.rid + lVar12);
            }
            else if (iVar13 == 2) {
              fVar14 = (float)(int)*(char *)((long)attrRec.rid + lVar12);
            }
            else {
              fVar14 = *(float *)((long)attrRec.rid + lVar12);
            }
            pfVar2 = (float *)((long)&local_1b8->maxValue + lVar11);
            if (*pfVar2 <= fVar14 && fVar14 != *pfVar2) {
              *(float *)((long)&local_1b8->maxValue + lVar11) = fVar14;
            }
            if (fVar14 < *(float *)((long)&local_1b8->minValue + lVar11)) {
              *(float *)((long)&local_1b8->minValue + lVar11) = fVar14;
            }
            if ((RM_FileHandle **)attrIt._0_8_ != ppRVar1) {
              operator_delete((void *)attrIt._0_8_);
            }
            lVar9 = lVar9 + 1;
            lVar11 = lVar11 + 0x30;
          } while (lVar9 < relEntry->attrCount);
        }
        relEntry->numTuples = relEntry->numTuples + 1;
        pSVar10 = local_1b0;
        RVar5 = (RC)local_1c0;
      }
      local_1c0 = (char *)CONCAT44(local_1c0._4_4_,RVar5);
    } while (RVar6 == 0);
  }
  goto LAB_0010b8a9;
  while( true ) {
    iVar3 = aEntry->attrNum;
    aEntry->minValue = local_1b8[iVar3].minValue;
    aEntry->maxValue = local_1b8[iVar3].maxValue;
    aEntry->numDistinct =
         (int)numDistinct.
              super__Vector_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[iVar3]._M_t._M_impl.super__Rb_tree_header.
              _M_node_count;
    RVar6 = RM_FileHandle::UpdateRec(fh_00,&attrRec);
    RVar5 = (RC)local_1c0;
    if (RVar6 != 0) {
      RVar5 = RVar6;
    }
    local_1c0 = (char *)CONCAT44(local_1c0._4_4_,RVar5);
    if (RVar6 != 0) break;
    iVar13 = iVar13 + 1;
    bVar4 = iVar13 < relEntry->attrCount;
    if (relEntry->attrCount <= iVar13) break;
LAB_0010b7f0:
    RVar5 = SM_AttrIterator::GetNextAttr(&attrIt,&attrRec,&aEntry);
    if (RVar5 != 0) {
      local_1c0 = (char *)CONCAT44(local_1c0._4_4_,RVar5);
      break;
    }
  }
LAB_0010b86d:
  RVar5 = (RC)local_1c0;
  if ((!bVar4) && (RVar5 = SM_AttrIterator::CloseIterator(&attrIt), RVar5 == 0)) {
    RVar5 = RM_FileHandle::ForcePages(fh_00,-1);
  }
  RM_Record::~RM_Record(&attrRec);
LAB_0010b89f:
  SM_AttrIterator::~SM_AttrIterator(&attrIt);
LAB_0010b8a9:
  RM_Record::~RM_Record(&rec);
  RM_FileHandle::~RM_FileHandle(&fh);
  RM_FileScan::~RM_FileScan(&fs);
  std::
  vector<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~vector(&numDistinct);
LAB_0010b8dd:
  RM_Record::~RM_Record(&relRec);
  return RVar5;
}

Assistant:

RC SM_Manager::CalcStats(const char *relName){
  RC rc = 0;
  cout << "Calculating stats for relation " << relName << endl;
  if(strlen(relName) > MAXNAME) // check for whether this is a valid name
    return (SM_BADRELNAME);

  // Retrieve the record associated with the relation
  RM_Record relRec;
  RelCatEntry *relEntry;
  if((rc = GetRelEntry(relName, relRec, relEntry)))
    return (rc);

  // Creates a struct containing info about the attributes to 
  // help with loading
  Attr* attributes = (Attr *)malloc(sizeof(Attr)*relEntry->attrCount);
  for(int i=0; i < relEntry->attrCount; i++){
    memset((void*)&attributes[i], 0, sizeof(attributes[i]));
    IX_IndexHandle ih;
    attributes[i] = (Attr) {0, 0, 0, 0, ih, recInsert_string, 0, FLT_MIN, FLT_MAX};
  }
  if((rc = PrepareAttr(relEntry, attributes)))
    return (rc);

  vector<set<string> > numDistinct(relEntry->attrCount);
  for(int i=0; i < relEntry->attrCount; i++){
    attributes[i].numDistinct = 0;
    attributes[i].maxValue = FLT_MIN;
    attributes[i].minValue = FLT_MAX;
  }
  relEntry->numTuples = 0;
  relEntry->statsInitialized = true;

  // Open the relation and iterate through it
  RM_FileScan fs;
  RM_FileHandle fh;
  RM_Record rec;
  if((rc = rmm.OpenFile(relName, fh)) || (rc = fs.OpenScan(fh, INT, 0, 0, NO_OP, NULL)))
    return (rc);
  while(RM_EOF != fs.GetNextRec(rec)){
    char * recData;
    if((rc = rec.GetData(recData)))
      return (rc);

    for(int i = 0;  i < relEntry->attrCount; i++){
      int offset = attributes[i].offset;
      string attr(recData + offset, recData + offset + attributes[i].length);
      numDistinct[i].insert(attr);
      float attrValue = 0.0;
      if(attributes[i].type == STRING)
        attrValue = ConvertStrToFloat(recData + offset);
      else if(attributes[i].type == INT)
        attrValue = (float) *((int*) (recData + offset));
      else
        attrValue = *((float*)(recData + offset));
      if(attrValue > attributes[i].maxValue)
        attributes[i].maxValue = attrValue;
      if(attrValue < attributes[i].minValue)
        attributes[i].minValue = attrValue;
    }
    relEntry->numTuples++;

  }

  // write everything back
  if((rc = relcatFH.UpdateRec(relRec)) || (rc = relcatFH.ForcePages()))
    return (rc);

  SM_AttrIterator attrIt;
  if((rc = attrIt.OpenIterator(attrcatFH, relEntry->relName)))
    return (rc);
  RM_Record attrRec;
  AttrCatEntry *aEntry;
  for(int i = 0; i < relEntry->attrCount; i++){
    if((rc = attrIt.GetNextAttr(attrRec, aEntry)))
      return (rc);
    // For each attribute, place its information in the appropriate slot
    int slot = aEntry->attrNum;
    aEntry->minValue = attributes[slot].minValue;
    aEntry->maxValue = attributes[slot].maxValue;
    aEntry->numDistinct = numDistinct[slot].size();
    if((rc = attrcatFH.UpdateRec(attrRec)))
      return (rc);
  }
  if((rc = attrIt.CloseIterator()))
    return (rc);
  if((rc = attrcatFH.ForcePages()))
    return (rc);


  return (0);
}